

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferTextureBufferRange.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferTextureBufferRange::getComputeShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferTextureBufferRange *this,FormatInfo *info)

{
  ostream *poVar1;
  char *pcVar2;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream result;
  ostream local_198;
  FormatInfo *local_20;
  FormatInfo *info_local;
  TextureBufferTextureBufferRange *this_local;
  
  local_20 = info;
  info_local = (FormatInfo *)this;
  this_local = (TextureBufferTextureBufferRange *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,
                           "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nlayout("
                          );
  FormatInfo::get_image_format_name_abi_cxx11_(&local_1d8,local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,", binding = 0) uniform highp readonly ");
  FormatInfo::get_image_type_name_abi_cxx11_(&local_1f8,local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           " image_buffer;\n\nlayout(binding = 0 ) buffer ComputeSSBOSize\n{\n    int outImageSize;\n} computeSSBOSize;\nlayout(binding = 1 ) buffer ComputeSSBOSizeValue\n{\n    "
                          );
  FormatInfo::get_output_type_name_abi_cxx11_(&local_218,local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           " outValue;\n} computeSSBOValue;\n\nlayout (local_size_x = 1 ) in;\n\nvoid main(void)\n{\n    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
                          );
  FormatInfo::get_value_selector_abi_cxx11_(&local_238,local_20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,";\n    computeSSBOSize.outImageSize = imageSize( image_buffer );\n}\n");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferTextureBufferRange::getComputeShaderCode(FormatInfo& info) const
{
	std::stringstream result;

	result << "${VERSION}\n"
			  "\n"
			  "${TEXTURE_BUFFER_REQUIRE}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout("
		   << info.get_image_format_name().c_str() << ", binding = 0) uniform highp readonly "
		   << info.get_image_type_name().c_str() << " image_buffer;\n"
													"\n"
													"layout(binding = 0 ) buffer ComputeSSBOSize\n"
													"{\n"
													"    int outImageSize;\n"
													"} computeSSBOSize;\n"
													"layout(binding = 1 ) buffer ComputeSSBOSizeValue\n"
													"{\n"
													"    "
		   << info.get_output_type_name().c_str() << " outValue;\n"
													 "} computeSSBOValue;\n"
													 "\n"
													 "layout (local_size_x = 1 ) in;\n"
													 "\n"
													 "void main(void)\n"
													 "{\n"
													 "    computeSSBOValue.outValue    = imageLoad( image_buffer, 0)"
		   << info.get_value_selector().c_str() << ";\n"
												   "    computeSSBOSize.outImageSize = imageSize( image_buffer );\n"
												   "}\n";

	return result.str();
}